

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int UnixVfs_lStat(char *zPath,jx9_value *pArray,jx9_value *pWorker)

{
  int iVar1;
  int iVar2;
  stat st;
  anon_union_8_3_18420de5_for_x local_b0;
  anon_union_8_3_18420de5_for_x local_a8;
  int local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_88;
  anon_union_8_3_18420de5_for_x local_80;
  int local_78;
  int local_70;
  anon_union_8_3_18420de5_for_x local_68;
  anon_union_8_3_18420de5_for_x local_58;
  anon_union_8_3_18420de5_for_x local_48;
  
  iVar1 = lstat(zPath,(stat *)&local_b0);
  iVar2 = -1;
  if (iVar1 == 0) {
    jx9MemObjRelease(pWorker);
    pWorker->x = local_b0;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"dev",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = local_a8;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"ino",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = (anon_union_8_3_18420de5_for_x)(long)local_98;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"mode",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = (anon_union_8_3_18420de5_for_x)(long)local_a0;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"nlink",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = (anon_union_8_3_18420de5_for_x)(long)local_94;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"uid",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = (anon_union_8_3_18420de5_for_x)(long)local_90;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"gid",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = (anon_union_8_3_18420de5_for_x)(long)local_88;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"rdev",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = local_80;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"size",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = local_68;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"atime",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = local_58;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"mtime",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = local_48;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"ctime",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = (anon_union_8_3_18420de5_for_x)(long)local_78;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"blksize",pWorker);
    jx9MemObjRelease(pWorker);
    pWorker->x = (anon_union_8_3_18420de5_for_x)(long)local_70;
    pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 2;
    jx9_array_add_strkey_elem(pArray,"blocks",pWorker);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int UnixVfs_lStat(const char *zPath, jx9_value *pArray, jx9_value *pWorker)
{
	struct stat st;
	int rc;
	rc = lstat(zPath, &st);
	if( rc != 0 ){ 
	 return -1;
	}
	/* dev */
	jx9_value_int64(pWorker, (jx9_int64)st.st_dev);
	jx9_array_add_strkey_elem(pArray, "dev", pWorker); /* Will make it's own copy */
	/* ino */
	jx9_value_int64(pWorker, (jx9_int64)st.st_ino);
	jx9_array_add_strkey_elem(pArray, "ino", pWorker); /* Will make it's own copy */
	/* mode */
	jx9_value_int(pWorker, (int)st.st_mode);
	jx9_array_add_strkey_elem(pArray, "mode", pWorker);
	/* nlink */
	jx9_value_int(pWorker, (int)st.st_nlink);
	jx9_array_add_strkey_elem(pArray, "nlink", pWorker); /* Will make it's own copy */
	/* uid, gid, rdev */
	jx9_value_int(pWorker, (int)st.st_uid);
	jx9_array_add_strkey_elem(pArray, "uid", pWorker);
	jx9_value_int(pWorker, (int)st.st_gid);
	jx9_array_add_strkey_elem(pArray, "gid", pWorker);
	jx9_value_int(pWorker, (int)st.st_rdev);
	jx9_array_add_strkey_elem(pArray, "rdev", pWorker);
	/* size */
	jx9_value_int64(pWorker, (jx9_int64)st.st_size);
	jx9_array_add_strkey_elem(pArray, "size", pWorker); /* Will make it's own copy */
	/* atime */
	jx9_value_int64(pWorker, (jx9_int64)st.st_atime);
	jx9_array_add_strkey_elem(pArray, "atime", pWorker); /* Will make it's own copy */
	/* mtime */
	jx9_value_int64(pWorker, (jx9_int64)st.st_mtime);
	jx9_array_add_strkey_elem(pArray, "mtime", pWorker); /* Will make it's own copy */
	/* ctime */
	jx9_value_int64(pWorker, (jx9_int64)st.st_ctime);
	jx9_array_add_strkey_elem(pArray, "ctime", pWorker); /* Will make it's own copy */
	/* blksize, blocks */
	jx9_value_int(pWorker, (int)st.st_blksize);		
	jx9_array_add_strkey_elem(pArray, "blksize", pWorker);
	jx9_value_int(pWorker, (int)st.st_blocks);
	jx9_array_add_strkey_elem(pArray, "blocks", pWorker);
	return JX9_OK;
}